

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

string * draco::GetFullPath(string *input_file_relative_path,string *sibling_file_full_path)

{
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  string *input_file_full_path;
  string local_48 [39];
  undefined1 local_21;
  long local_20;
  char *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::__cxx11::string::find_last_of(in_RDX,0x2112a4);
  local_21 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  if (local_20 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_18);
    std::__cxx11::string::operator=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  std::__cxx11::string::operator+=((string *)in_RDI,local_10);
  return in_RDI;
}

Assistant:

std::string GetFullPath(const std::string &input_file_relative_path,
                        const std::string &sibling_file_full_path) {
  const auto pos = sibling_file_full_path.find_last_of("/\\");
  std::string input_file_full_path;
  if (pos != std::string::npos) {
    input_file_full_path = sibling_file_full_path.substr(0, pos + 1);
  }
  input_file_full_path += input_file_relative_path;
  return input_file_full_path;
}